

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::binary_go<signed_char,double>
          (Boxed_Number *this,Opers t_oper,char *t,double *u,Boxed_Value *t_lhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bad_any_cast *this_00;
  double dVar2;
  Boxed_Value BVar3;
  
  switch(t_oper) {
  case assign:
    dVar2 = *u;
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  case assign_product:
    dVar2 = (double)(int)*t * *u;
    break;
  case assign_sum:
    dVar2 = (double)(int)*t + *u;
    break;
  case assign_quotient:
    dVar2 = (double)(int)*t / *u;
    break;
  case assign_difference:
    dVar2 = (double)(int)*t - *u;
  }
  *t = (char)(int)dVar2;
  (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (t_lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (t_lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign:
            t = u;
            break;
          case Operators::assign_product:
            t *= u;
            break;
          case Operators::assign_sum:
            t += u;
            break;
          case Operators::assign_quotient:
            check_divide_by_zero(u);
            t /= u;
            break;
          case Operators::assign_difference:
            t -= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }